

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * soul::Value::createStringLiteral(Value *__return_storage_ptr__,Handle h)

{
  Type local_48;
  PackedData local_30;
  
  local_48.category = stringLiteral;
  local_48._1_8_ = 0;
  local_48._9_7_ = 0;
  local_48.structure.object._0_1_ = 0;
  local_48.structure.object._1_7_ = 0;
  Value(__return_storage_ptr__,&local_48);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
  getData(&local_30,__return_storage_ptr__);
  PackedData::setAs<choc::value::StringDictionary::Handle>(&local_30,h);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createStringLiteral (StringDictionary::Handle h)
{
    Value v (Type::createStringLiteral());
    v.getData().setAs (h);
    return v;
}